

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::CollapseButton(ImGuiID id,ImVec2 *pos)

{
  ImDrawList *this;
  ImGuiContext *pIVar1;
  bool bVar2;
  ImVec2 p_min;
  ImGuiCol local_94;
  ImVec2 local_78;
  ImVec2 local_70;
  ImVec2 local_68;
  ImU32 local_60;
  byte local_5b;
  bool local_5a;
  bool local_59;
  ImU32 col;
  bool pressed;
  bool held;
  bool hovered;
  ImVec2 local_50;
  ImVec2 local_48;
  ImVec2 local_40;
  undefined1 local_38 [8];
  ImRect bb;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImVec2 *pos_local;
  ImGuiID id_local;
  
  pIVar1 = GImGui;
  bb.Max = (ImVec2)GImGui->CurrentWindow;
  ImVec2::ImVec2(&local_50,GImGui->FontSize,GImGui->FontSize);
  local_48 = operator+(pos,&local_50);
  _col = ::operator*(&(pIVar1->Style).FramePadding,2.0);
  local_40 = operator+(&local_48,(ImVec2 *)&col);
  ImRect::ImRect((ImRect *)local_38,pos,&local_40);
  ItemAdd((ImRect *)local_38,id,(ImRect *)0x0);
  local_5b = ButtonBehavior((ImRect *)local_38,id,&local_59,&local_5a,0);
  if (((local_5a & 1U) == 0) || ((local_59 & 1U) == 0)) {
    local_94 = 0x15;
    if ((local_59 & 1U) != 0) {
      local_94 = 0x16;
    }
  }
  else {
    local_94 = 0x17;
  }
  local_60 = GetColorU32(local_94,1.0);
  if (((local_59 & 1U) != 0) || ((local_5a & 1U) != 0)) {
    this = *(ImDrawList **)((long)bb.Max + 0x2a8);
    local_70 = ImRect::GetCenter((ImRect *)local_38);
    ImVec2::ImVec2(&local_78,0.0,-0.5);
    local_68 = operator+(&local_70,&local_78);
    ImDrawList::AddCircleFilled(this,&local_68,pIVar1->FontSize * 0.5 + 1.0,local_60,9);
  }
  p_min = operator+((ImVec2 *)local_38,&(pIVar1->Style).FramePadding);
  RenderArrow(p_min,((byte)~*(byte *)((long)bb.Max + 0x81) & 1) * 2 + 1,1.0);
  bVar2 = IsItemActive();
  if ((bVar2) && (bVar2 = IsMouseDragging(0,-1.0), bVar2)) {
    StartMouseMovingWindow((ImGuiWindow *)bb.Max);
  }
  return (bool)(local_5b & 1);
}

Assistant:

bool ImGui::CollapseButton(ImGuiID id, const ImVec2& pos)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    ImRect bb(pos, pos + ImVec2(g.FontSize, g.FontSize) + g.Style.FramePadding * 2.0f);
    ItemAdd(bb, id);
    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held, ImGuiButtonFlags_None);

    ImU32 col = GetColorU32((held && hovered) ? ImGuiCol_ButtonActive : hovered ? ImGuiCol_ButtonHovered : ImGuiCol_Button);
    if (hovered || held)
        window->DrawList->AddCircleFilled(bb.GetCenter() + ImVec2(0.0f, -0.5f), g.FontSize * 0.5f + 1.0f, col, 9);
    RenderArrow(bb.Min + g.Style.FramePadding, window->Collapsed ? ImGuiDir_Right : ImGuiDir_Down, 1.0f);

    // Switch to moving the window after mouse is moved beyond the initial drag threshold
    if (IsItemActive() && IsMouseDragging())
        StartMouseMovingWindow(window);

    return pressed;
}